

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_writer.cpp
# Opt level: O0

ssize_t __thiscall BufferWriter::write(BufferWriter *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  char *pcVar2;
  undefined4 in_XMM0_Da;
  float value_local;
  BufferWriter *this_local;
  
  bVar1 = isFull(this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!isFull()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/PolarNick239[P]ExternalSortingOnGPU/src/io_utils/buffer_writer.cpp"
                  ,0xe,"void BufferWriter::write(float)");
  }
  pcVar2 = std::vector<char,_std::allocator<char>_>::data(&this->data);
  *(undefined4 *)(pcVar2 + this->offset) = in_XMM0_Da;
  this->offset = this->offset + 4;
  return (ssize_t)this;
}

Assistant:

void BufferWriter::write(float value)
{
	assert(!isFull());
	*((float*) (data.data() + offset)) = value;
	offset += sizeof(float);
}